

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O1

mat<double,_4,_4> * linalg::adjugate<double>(mat<double,_4,_4> *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  mat<double,_4,_4> *in_RDI;
  
  dVar1 = (a->y).y;
  dVar2 = (a->z).z;
  dVar3 = (a->w).w;
  dVar4 = (a->w).y;
  dVar5 = (a->y).z;
  dVar6 = (a->z).w;
  dVar7 = (a->z).y;
  dVar8 = (a->w).z;
  dVar9 = (a->y).w;
  dVar10 = (a->x).y;
  dVar11 = (a->x).z;
  dVar12 = (a->x).w;
  dVar13 = (a->w).x;
  dVar14 = (a->z).x;
  dVar15 = (a->y).x;
  dVar16 = (a->x).x;
  (in_RDI->x).x =
       (((dVar7 * dVar8 * dVar9 + dVar1 * dVar2 * dVar3 + dVar4 * dVar5 * dVar6) -
        dVar1 * dVar8 * dVar6) - dVar5 * dVar7 * dVar3) - dVar2 * dVar4 * dVar9;
  (in_RDI->x).y =
       (((dVar2 * dVar4 * dVar12 + dVar8 * dVar10 * dVar6 + dVar3 * dVar7 * dVar11) -
        dVar4 * dVar11 * dVar6) - dVar7 * dVar8 * dVar12) - dVar2 * dVar10 * dVar3;
  (in_RDI->x).z =
       (((dVar1 * dVar8 * dVar12 + dVar5 * dVar10 * dVar3 + dVar9 * dVar4 * dVar11) -
        dVar8 * dVar10 * dVar9) - dVar1 * dVar11 * dVar3) - dVar4 * dVar5 * dVar12;
  (in_RDI->x).w =
       (((dVar5 * dVar7 * dVar12 + dVar2 * dVar10 * dVar9 + dVar6 * dVar1 * dVar11) -
        dVar5 * dVar10 * dVar6) - dVar7 * dVar11 * dVar9) - dVar1 * dVar2 * dVar12;
  (in_RDI->y).x =
       (((dVar6 * dVar8 * dVar15 + dVar3 * dVar5 * dVar14 + dVar2 * dVar9 * dVar13) -
        dVar5 * dVar6 * dVar13) - dVar8 * dVar9 * dVar14) - dVar2 * dVar3 * dVar15;
  (in_RDI->y).y =
       (((dVar2 * dVar3 * dVar16 + dVar6 * dVar11 * dVar13 + dVar8 * dVar12 * dVar14) -
        dVar3 * dVar11 * dVar14) - dVar2 * dVar12 * dVar13) - dVar6 * dVar8 * dVar16;
  (in_RDI->y).z =
       (((dVar8 * dVar9 * dVar16 + dVar3 * dVar11 * dVar15 + dVar5 * dVar12 * dVar13) -
        dVar9 * dVar11 * dVar13) - dVar8 * dVar12 * dVar15) - dVar3 * dVar5 * dVar16;
  (in_RDI->y).w =
       (((dVar5 * dVar6 * dVar16 + dVar9 * dVar11 * dVar14 + dVar2 * dVar12 * dVar15) -
        dVar6 * dVar11 * dVar15) - dVar5 * dVar12 * dVar14) - dVar2 * dVar9 * dVar16;
  (in_RDI->z).x =
       (((dVar6 * dVar13 * dVar1 + dVar9 * dVar14 * dVar4 + dVar7 * dVar3 * dVar15) -
        dVar9 * dVar13 * dVar7) - dVar6 * dVar15 * dVar4) - dVar3 * dVar14 * dVar1;
  (in_RDI->z).y =
       (((dVar3 * dVar14 * dVar10 + dVar12 * dVar13 * dVar7 + dVar4 * dVar6 * dVar16) -
        dVar12 * dVar14 * dVar4) - dVar3 * dVar16 * dVar7) - dVar6 * dVar13 * dVar10;
  (in_RDI->z).z =
       (((dVar9 * dVar13 * dVar10 + dVar12 * dVar15 * dVar4 + dVar1 * dVar3 * dVar16) -
        dVar12 * dVar13 * dVar1) - dVar9 * dVar16 * dVar4) - dVar3 * dVar15 * dVar10;
  (in_RDI->z).w =
       (((dVar6 * dVar15 * dVar10 + dVar12 * dVar14 * dVar1 + dVar7 * dVar9 * dVar16) -
        dVar12 * dVar15 * dVar7) - dVar6 * dVar16 * dVar1) - dVar9 * dVar14 * dVar10;
  (in_RDI->w).x =
       (((dVar7 * dVar13 * dVar5 + dVar4 * dVar15 * dVar2 + dVar8 * dVar1 * dVar14) -
        dVar7 * dVar15 * dVar8) - dVar1 * dVar13 * dVar2) - dVar4 * dVar14 * dVar5;
  (in_RDI->w).y =
       (((dVar4 * dVar14 * dVar11 + dVar7 * dVar16 * dVar8 + dVar2 * dVar13 * dVar10) -
        dVar4 * dVar16 * dVar2) - dVar14 * dVar10 * dVar8) - dVar7 * dVar13 * dVar11;
  (in_RDI->w).z =
       (((dVar1 * dVar13 * dVar11 + dVar4 * dVar16 * dVar5 + dVar8 * dVar10 * dVar15) -
        dVar8 * dVar1 * dVar16) - dVar13 * dVar10 * dVar5) - dVar4 * dVar15 * dVar11;
  (in_RDI->w).w =
       (((dVar7 * dVar15 * dVar11 + dVar1 * dVar16 * dVar2 + dVar14 * dVar10 * dVar5) -
        dVar7 * dVar16 * dVar5) - dVar10 * dVar15 * dVar2) - dVar1 * dVar14 * dVar11;
  return in_RDI;
}

Assistant:

constexpr linalg::mat<T,4,4> linalg::adjugate(const mat<T,4,4> & a) 
{
    return {{a.y.y*a.z.z*a.w.w + a.w.y*a.y.z*a.z.w + a.z.y*a.w.z*a.y.w - a.y.y*a.w.z*a.z.w - a.z.y*a.y.z*a.w.w - a.w.y*a.z.z*a.y.w,
             a.x.y*a.w.z*a.z.w + a.z.y*a.x.z*a.w.w + a.w.y*a.z.z*a.x.w - a.w.y*a.x.z*a.z.w - a.z.y*a.w.z*a.x.w - a.x.y*a.z.z*a.w.w,
             a.x.y*a.y.z*a.w.w + a.w.y*a.x.z*a.y.w + a.y.y*a.w.z*a.x.w - a.x.y*a.w.z*a.y.w - a.y.y*a.x.z*a.w.w - a.w.y*a.y.z*a.x.w,
             a.x.y*a.z.z*a.y.w + a.y.y*a.x.z*a.z.w + a.z.y*a.y.z*a.x.w - a.x.y*a.y.z*a.z.w - a.z.y*a.x.z*a.y.w - a.y.y*a.z.z*a.x.w},
            {a.y.z*a.w.w*a.z.x + a.z.z*a.y.w*a.w.x + a.w.z*a.z.w*a.y.x - a.y.z*a.z.w*a.w.x - a.w.z*a.y.w*a.z.x - a.z.z*a.w.w*a.y.x,
             a.x.z*a.z.w*a.w.x + a.w.z*a.x.w*a.z.x + a.z.z*a.w.w*a.x.x - a.x.z*a.w.w*a.z.x - a.z.z*a.x.w*a.w.x - a.w.z*a.z.w*a.x.x,
             a.x.z*a.w.w*a.y.x + a.y.z*a.x.w*a.w.x + a.w.z*a.y.w*a.x.x - a.x.z*a.y.w*a.w.x - a.w.z*a.x.w*a.y.x - a.y.z*a.w.w*a.x.x,
             a.x.z*a.y.w*a.z.x + a.z.z*a.x.w*a.y.x + a.y.z*a.z.w*a.x.x - a.x.z*a.z.w*a.y.x - a.y.z*a.x.w*a.z.x - a.z.z*a.y.w*a.x.x},
            {a.y.w*a.z.x*a.w.y + a.w.w*a.y.x*a.z.y + a.z.w*a.w.x*a.y.y - a.y.w*a.w.x*a.z.y - a.z.w*a.y.x*a.w.y - a.w.w*a.z.x*a.y.y,
             a.x.w*a.w.x*a.z.y + a.z.w*a.x.x*a.w.y + a.w.w*a.z.x*a.x.y - a.x.w*a.z.x*a.w.y - a.w.w*a.x.x*a.z.y - a.z.w*a.w.x*a.x.y,
             a.x.w*a.y.x*a.w.y + a.w.w*a.x.x*a.y.y + a.y.w*a.w.x*a.x.y - a.x.w*a.w.x*a.y.y - a.y.w*a.x.x*a.w.y - a.w.w*a.y.x*a.x.y,
             a.x.w*a.z.x*a.y.y + a.y.w*a.x.x*a.z.y + a.z.w*a.y.x*a.x.y - a.x.w*a.y.x*a.z.y - a.z.w*a.x.x*a.y.y - a.y.w*a.z.x*a.x.y},
            {a.y.x*a.w.y*a.z.z + a.z.x*a.y.y*a.w.z + a.w.x*a.z.y*a.y.z - a.y.x*a.z.y*a.w.z - a.w.x*a.y.y*a.z.z - a.z.x*a.w.y*a.y.z,
             a.x.x*a.z.y*a.w.z + a.w.x*a.x.y*a.z.z + a.z.x*a.w.y*a.x.z - a.x.x*a.w.y*a.z.z - a.z.x*a.x.y*a.w.z - a.w.x*a.z.y*a.x.z,
             a.x.x*a.w.y*a.y.z + a.y.x*a.x.y*a.w.z + a.w.x*a.y.y*a.x.z - a.x.x*a.y.y*a.w.z - a.w.x*a.x.y*a.y.z - a.y.x*a.w.y*a.x.z,
             a.x.x*a.y.y*a.z.z + a.z.x*a.x.y*a.y.z + a.y.x*a.z.y*a.x.z - a.x.x*a.z.y*a.y.z - a.y.x*a.x.y*a.z.z - a.z.x*a.y.y*a.x.z}}; 
}